

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

obj_attr_accessor * __thiscall
pybind11::detail::object_api<pybind11::handle>::attr
          (obj_attr_accessor *__return_storage_ptr__,object_api<pybind11::handle> *this,object *key)

{
  PyObject *pPVar1;
  PyObject *pPVar2;
  handle local_10;
  
  pPVar1 = *(PyObject **)this;
  pPVar2 = (key->super_handle).m_ptr;
  (key->super_handle).m_ptr = (PyObject *)0x0;
  (__return_storage_ptr__->obj).m_ptr = pPVar1;
  (__return_storage_ptr__->key).super_handle.m_ptr = pPVar2;
  local_10.m_ptr = (PyObject *)0x0;
  (__return_storage_ptr__->cache).super_handle.m_ptr = (PyObject *)0x0;
  handle::dec_ref(&local_10);
  return __return_storage_ptr__;
}

Assistant:

obj_attr_accessor object_api<D>::attr(object &&key) const {
    return {derived(), std::move(key)};
}